

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

double __thiscall ChebTools::ChebyshevExpansion::y_recurrence(ChebyshevExpansion *this,double x)

{
  double dVar1;
  double dVar2;
  Index IVar3;
  Scalar *pSVar4;
  vectype *this_00;
  double dVar5;
  int local_3c;
  int n;
  vectype *o;
  double xscaled;
  size_t Norder;
  double x_local;
  ChebyshevExpansion *this_local;
  
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  dVar5 = (x + x + -(this->m_xmax + this->m_xmin)) / (this->m_xmax - this->m_xmin);
  if (IVar3 == 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
    this_local = (ChebyshevExpansion *)*pSVar4;
  }
  else if (IVar3 - 1U == 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
    dVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
    this_local = (ChebyshevExpansion *)(*pSVar4 * dVar5 + dVar1);
  }
  else {
    this_00 = &this->m_recurrence_buffer;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    *pSVar4 = 1.0;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,1);
    *pSVar4 = dVar5;
    for (local_3c = 1; (ulong)(long)local_3c < IVar3 - 1U; local_3c = local_3c + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          (long)local_3c);
      dVar1 = *pSVar4;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          (long)(local_3c + -1));
      dVar2 = *pSVar4;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          (long)(local_3c + 1));
      *pSVar4 = dVar5 * 2.0 * dVar1 + -dVar2;
    }
    this_local = (ChebyshevExpansion *)
                 Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                 dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
  }
  return (double)this_local;
}

Assistant:

double ChebyshevExpansion::y_recurrence(const double x) {
        // Use the recurrence relationships to evaluate the Chebyshev expansion
        std::size_t Norder = m_c.size() - 1;
        // Scale x linearly into the domain [-1, 1]
        double xscaled = (2 * x - (m_xmax + m_xmin)) / (m_xmax - m_xmin);
        // Short circuit if not using recursive solution
        if (Norder == 0){ return m_c[0]; }
        if (Norder == 1) { return m_c[0] + m_c[1]*xscaled; }

        vectype &o = m_recurrence_buffer;
        o(0) = 1;
        o(1) = xscaled;
        for (int n = 1; n < Norder; ++n) {
            o(n + 1) = 2 * xscaled*o(n) - o(n - 1);
        }
        return m_c.dot(o);
    }